

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall nuraft::buffer_serializer::pos(buffer_serializer *this,size_t new_pos)

{
  size_t sVar1;
  overflow_error *this_00;
  ulong in_RSI;
  long in_RDI;
  
  sVar1 = nuraft::buffer::size(*(buffer **)(in_RDI + 8));
  if (sVar1 < in_RSI) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"invalid position");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  *(ulong *)(in_RDI + 0x10) = in_RSI;
  return;
}

Assistant:

void buffer_serializer::pos(size_t new_pos) {
    if (new_pos > buf_.size()) throw std::overflow_error("invalid position");
    pos_ = new_pos;
}